

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.cpp
# Opt level: O2

void uniform_sampling(uint blocks)

{
  allocator<char> local_2891;
  string local_2890;
  string local_2870;
  Histogram<unsigned_int> histogram;
  UniformSampler sampler;
  FixedDegreeNetwork network;
  Random rng;
  
  FixedDegreeNetwork::FixedDegreeNetwork((FixedDegreeNetwork *)&network.super_Network,3,blocks);
  Histogram<unsigned_int>::Histogram
            (&histogram,0,network.super_Network.total_triangles / 3,
             network.super_Network.total_triangles / 3 + 1);
  Random::Random(&rng,2);
  sampler._vptr_UniformSampler = (_func_int **)&PTR_markov_step_00110cd0;
  sampler.super_Sampler.rng = &rng;
  sampler.super_Sampler.histogram = &histogram;
  sampler.proposer.rng = &rng;
  sampler.network = &network.super_Network;
  UniformSampler::sample(&sampler,1000000);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2890,"uniform_%d.dat",&local_2891);
  format(&local_2870,&local_2890,blocks);
  Histogram<unsigned_int>::export_histogram(&histogram,&local_2870);
  std::__cxx11::string::~string((string *)&local_2870);
  std::__cxx11::string::~string((string *)&local_2890);
  std::random_device::~random_device(&rng.rd);
  Histogram<unsigned_int>::~Histogram(&histogram);
  Network::~Network(&network.super_Network);
  return;
}

Assistant:

void uniform_sampling(unsigned int blocks) {
    FixedDegreeNetwork network(3, blocks);

    Histogram<unsigned int> histogram(0, network.get_triangles(),
                                      network.get_triangles() + 1);
    Random rng(2);

    UniformSampler sampler(rng, histogram, network);
    sampler.sample(1000000);

    histogram.export_histogram(format("uniform_%d.dat", blocks));
}